

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O3

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::MaybeAddResult
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,S2Shape *shape,int edge_id)

{
  S1ChordAngle SVar1;
  int iVar2;
  S2MinDistance distance;
  Edge edge;
  Result local_60;
  pair<gtl::dense_hashtable_const_iterator<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>,_bool>
  local_50;
  
  if (this->avoid_duplicates_ == true) {
    local_60.distance_.super_S1ChordAngle.length2_._4_4_ = edge_id;
    local_60.distance_.super_S1ChordAngle.length2_._0_4_ = shape->id_;
    gtl::
    dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
    ::insert(&local_50,&this->tested_edges_,(value_type *)&local_60);
    if (local_50.second == false) {
      return;
    }
  }
  (*shape->_vptr_S2Shape[3])(&local_50,shape,(ulong)(uint)edge_id);
  SVar1.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
  iVar2 = (*this->target_->_vptr_S2DistanceTarget[4])(this->target_,&local_50,&local_50.second);
  if ((char)iVar2 != '\0') {
    local_60.shape_id_ = shape->id_;
    local_60.distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)SVar1.length2_;
    local_60.edge_id_ = edge_id;
    AddResult(this,&local_60);
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::MaybeAddResult(
    const S2Shape& shape, int edge_id) {
  if (avoid_duplicates_ &&
      !tested_edges_.insert(ShapeEdgeId(shape.id(), edge_id)).second) {
    return;
  }
  auto edge = shape.edge(edge_id);
  Distance distance = distance_limit_;
  if (target_->UpdateMinDistance(edge.v0, edge.v1, &distance)) {
    AddResult(Result(distance, shape.id(), edge_id));
  }
}